

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_membuf.c
# Opt level: O0

void membuff_add_fstring(membuff_t *mb,char *fmt,...)

{
  int iVar1;
  char local_438 [4];
  int n;
  char buffer [1024];
  va_list args;
  char *fmt_local;
  membuff_t *mb_local;
  
  buffer[0x3fc] = '0';
  buffer[0x3fd] = '\0';
  buffer[0x3fe] = '\0';
  buffer[0x3ff] = '\0';
  buffer[0x3f8] = '\x10';
  buffer[0x3f9] = '\0';
  buffer[0x3fa] = '\0';
  buffer[0x3fb] = '\0';
  iVar1 = vsnprintf(local_438,0x400,fmt,buffer + 0x3f8);
  if (iVar1 < 0) {
    abort();
  }
  membuff_add_string(mb,local_438);
  return;
}

Assistant:

void membuff_add_fstring(membuff_t *mb, const char *fmt, ...) {
  va_list args;
  char buffer[1024];

  va_start(args, fmt);
  int n = vsnprintf(buffer, sizeof buffer, fmt, args);
  va_end(args);
  if (n < 0) { abort(); }
  membuff_add_string(mb, buffer);
}